

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_query_tests.cpp
# Opt level: O2

void __thiscall
QueryTests_DropContainer_canDetermineSpecificationForDropContainer_Test::TestBody
          (QueryTests_DropContainer_canDetermineSpecificationForDropContainer_Test *this)

{
  bool bVar1;
  char *in_R9;
  AssertHelper AStack_168;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  string local_158;
  AssertionResult gtest_ar_;
  Query query_drop_container;
  
  database::Query::Query(&query_drop_container,"drop container company.employee");
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = query_drop_container.m_transaction_metatype == ddl;
  if (gtest_ar_.success_) {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    std::__cxx11::string::string
              ((string *)&local_158,(string *)&query_drop_container.m_database_name);
    gtest_ar_.success_ = std::operator==(&local_158,"company");
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    std::__cxx11::string::~string((string *)&local_158);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&local_160);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_158,(internal *)&gtest_ar_,
                 (AssertionResult *)"query_drop_container.databaseName() == \"company\"","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&AStack_168,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                 ,0xf0,local_158._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&AStack_168,(Message *)&local_160);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      std::__cxx11::string::string
                ((string *)&local_158,(string *)&query_drop_container.m_container_name);
      bVar1 = std::operator==(&local_158,"employee");
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      gtest_ar_.success_ = bVar1;
      std::__cxx11::string::~string((string *)&local_158);
      if (bVar1) goto LAB_001137fe;
      testing::Message::Message((Message *)&local_160);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_158,(internal *)&gtest_ar_,
                 (AssertionResult *)"query_drop_container.containerName() == \"employee\"","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&AStack_168,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                 ,0xf1,local_158._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&AStack_168,(Message *)&local_160);
    }
  }
  else {
    testing::Message::Message((Message *)&local_160);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_158,(internal *)&gtest_ar_,
               (AssertionResult *)"query_drop_container.transactionMetaType() == database::ddl",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_168,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
               ,0xef,local_158._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_168,(Message *)&local_160);
  }
  testing::internal::AssertHelper::~AssertHelper(&AStack_168);
  std::__cxx11::string::~string((string *)&local_158);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_160);
LAB_001137fe:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  database::Query::~Query(&query_drop_container);
  return;
}

Assistant:

TEST(QueryTests_DropContainer,canDetermineSpecificationForDropContainer)
{
  database::Query query_drop_container = "drop container company.employee";
  ASSERT_TRUE(query_drop_container.transactionMetaType() == database::ddl);
  ASSERT_TRUE(query_drop_container.databaseName() == "company");
  ASSERT_TRUE(query_drop_container.containerName() == "employee");
}